

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O2

void av1_init_tile_data(AV1_COMP *cpi)

{
  TokenList *(*papTVar1) [64];
  uint uVar2;
  uint uVar3;
  TileDataEnc *pTVar4;
  byte bVar5;
  uint num_planes;
  int iVar6;
  TokenExtra *pTVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  void *__dest;
  ulong uVar13;
  ulong uVar14;
  TileInfo *tile;
  bool bVar15;
  uint local_88;
  int local_84;
  TokenExtra *local_78;
  TokenList *local_70;
  TokenList *(*local_68) [64];
  
  num_planes = (uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1;
  uVar2 = (cpi->common).tiles.cols;
  uVar3 = (cpi->common).tiles.rows;
  local_78 = (cpi->token_info).tile_tok[0][0];
  papTVar1 = (cpi->token_info).tplist;
  local_70 = (cpi->token_info).tplist[0][0];
  if ((((cpi->oxcf).pass != AOM_RC_FIRST_PASS) && (cpi->compressor_stage != '\x01')) &&
     ((cpi->common).features.allow_screen_content_tools == true)) {
    uVar10 = 2;
    if (num_planes < 2) {
      uVar10 = num_planes;
    }
    uVar10 = ((cpi->common).mi_params.mb_cols + 7U >> 3) *
             ((cpi->common).mi_params.mb_rows + 7U >> 3) * uVar10 * 0x4000;
    if ((cpi->token_info).tokens_allocated < uVar10) {
      aom_free(local_78);
      (cpi->token_info).tile_tok[0][0] = (TokenExtra *)0x0;
      aom_free((cpi->token_info).tplist[0][0]);
      (cpi->token_info).tplist[0][0] = (TokenList *)0x0;
      iVar6 = (cpi->common).mi_params.mi_rows;
      bVar5 = (byte)((cpi->common).seq_params)->mib_size_log2;
      (cpi->token_info).tokens_allocated = uVar10;
      pTVar7 = (TokenExtra *)aom_calloc((ulong)uVar10,1);
      (cpi->token_info).tile_tok[0][0] = pTVar7;
      if (pTVar7 == (TokenExtra *)0x0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate token_info->tile_tok[0][0]");
      }
      local_70 = (TokenList *)
                 aom_calloc((long)((iVar6 + (1 << (bVar5 & 0x1f)) + -1 >> (bVar5 & 0x1f)) << 0xc),
                            0x10);
      (*papTVar1)[0] = local_70;
      if (local_70 == (TokenList *)0x0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate token_info->tplist[0][0]");
        local_70 = (cpi->token_info).tplist[0][0];
      }
      local_78 = (cpi->token_info).tile_tok[0][0];
    }
  }
  uVar12 = 0;
  uVar8 = 0;
  if (0 < (int)uVar2) {
    uVar8 = (ulong)uVar2;
  }
  uVar13 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar13 = uVar12;
  }
  local_88 = 0;
  local_84 = 0;
  local_68 = papTVar1;
  for (uVar9 = 0; uVar9 != uVar13; uVar9 = uVar9 + 1) {
    uVar11 = uVar12;
    for (uVar14 = 0; uVar8 != uVar14; uVar14 = uVar14 + 1) {
      pTVar4 = cpi->tile_data;
      tile = (TileInfo *)((long)((pTVar4->tctx).txb_skip_cdf + -1) + 0x2e + uVar11);
      av1_tile_init(tile,&cpi->common,(int)uVar9,(int)uVar14);
      *(undefined4 *)((long)&(pTVar4->firstpass_top_mv).row + uVar11) = 0;
      *(undefined8 *)((long)pTVar4->inter_mode_rd_models + (uVar11 - 0x10)) = 0;
      if (((cpi->token_info).tile_tok[0][0] != (TokenExtra *)0x0) &&
         ((*papTVar1)[0] != (TokenList *)0x0)) {
        local_78 = local_78 + local_88;
        (*(TokenExtra *(*) [64])(local_68 + -0x40))[uVar14] = local_78;
        local_88 = get_token_alloc((*(int *)((long)((pTVar4->tctx).txb_skip_cdf + -1) + 0x32 +
                                            uVar11) -
                                   *(int *)((long)((pTVar4->tctx).txb_skip_cdf + -1) + 0x2e + uVar11
                                           )) + 2 >> 2,
                                   (*(int *)((long)((pTVar4->tctx).txb_skip_cdf + -1) + 0x3a +
                                            uVar11) -
                                   *(int *)((long)((pTVar4->tctx).txb_skip_cdf + -1) + 0x36 + uVar11
                                           )) + 2 >> 2,((cpi->common).seq_params)->mib_size_log2 + 2
                                   ,num_planes);
        local_70 = local_70 + local_84;
        (*local_68)[uVar14] = local_70;
        local_84 = av1_get_sb_rows_in_tile(&cpi->common,tile);
      }
      bVar15 = (cpi->common).tiles.large_scale == 0;
      *(bool *)((long)pTVar4->inter_mode_rd_models + (uVar11 - 8)) = bVar15;
      if ((bVar15) && ((cpi->common).features.disable_cdf_update == false)) {
        iVar6 = delay_wait_for_top_right_sb(cpi);
        bVar5 = (byte)iVar6 ^ 1;
      }
      else {
        bVar5 = 0;
      }
      __dest = (void *)((long)(pTVar4->tctx).txb_skip_cdf[0][0] + uVar11);
      *(byte *)((long)__dest + 0x5310) = bVar5;
      memcpy(__dest,(cpi->common).fc,0x52fc);
      uVar11 = uVar11 + 0x5d10;
    }
    uVar12 = uVar12 + (long)(int)uVar2 * 0x5d10;
    local_68 = local_68 + 1;
  }
  return;
}

Assistant:

void av1_init_tile_data(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  int tile_col, tile_row;
  TokenInfo *const token_info = &cpi->token_info;
  TokenExtra *pre_tok = token_info->tile_tok[0][0];
  TokenList *tplist = token_info->tplist[0][0];
  unsigned int tile_tok = 0;
  int tplist_count = 0;

  if (!is_stat_generation_stage(cpi) &&
      cm->features.allow_screen_content_tools) {
    // Number of tokens for which token info needs to be allocated.
    unsigned int tokens_required =
        get_token_alloc(cm->mi_params.mb_rows, cm->mi_params.mb_cols,
                        MAX_SB_SIZE_LOG2, num_planes);
    // Allocate/reallocate memory for token related info if the number of tokens
    // required is more than the number of tokens already allocated. This could
    // occur in case of the following:
    // 1) If the memory is not yet allocated
    // 2) If the frame dimensions have changed
    const bool realloc_tokens = tokens_required > token_info->tokens_allocated;
    if (realloc_tokens) {
      free_token_info(token_info);
      alloc_token_info(cm, token_info, tokens_required);
      pre_tok = token_info->tile_tok[0][0];
      tplist = token_info->tplist[0][0];
    }
  }

  for (tile_row = 0; tile_row < tile_rows; ++tile_row) {
    for (tile_col = 0; tile_col < tile_cols; ++tile_col) {
      TileDataEnc *const tile_data =
          &cpi->tile_data[tile_row * tile_cols + tile_col];
      TileInfo *const tile_info = &tile_data->tile_info;
      av1_tile_init(tile_info, cm, tile_row, tile_col);
      tile_data->firstpass_top_mv = kZeroMv;
      tile_data->abs_sum_level = 0;

      if (is_token_info_allocated(token_info)) {
        token_info->tile_tok[tile_row][tile_col] = pre_tok + tile_tok;
        pre_tok = token_info->tile_tok[tile_row][tile_col];
        tile_tok = allocated_tokens(
            tile_info, cm->seq_params->mib_size_log2 + MI_SIZE_LOG2,
            num_planes);
        token_info->tplist[tile_row][tile_col] = tplist + tplist_count;
        tplist = token_info->tplist[tile_row][tile_col];
        tplist_count = av1_get_sb_rows_in_tile(cm, tile_info);
      }
      tile_data->allow_update_cdf = !cm->tiles.large_scale;
      tile_data->allow_update_cdf = tile_data->allow_update_cdf &&
                                    !cm->features.disable_cdf_update &&
                                    !delay_wait_for_top_right_sb(cpi);
      tile_data->tctx = *cm->fc;
    }
  }
}